

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest_AnnotatesMapSemantics_Test::
~CppMetadataTest_AnnotatesMapSemantics_Test(CppMetadataTest_AnnotatesMapSemantics_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(CppMetadataTest, AnnotatesMapSemantics) {
  FileDescriptorProto file;
  GeneratedCodeInfo info;
  std::string pb_h;
  atu::AddFile("test.proto", kMapFieldTestFile);
  EXPECT_TRUE(CaptureMetadata("test.proto", &file, &pb_h, &info, nullptr,
                              nullptr, nullptr));
  EXPECT_EQ("Message", file.message_type(0).name());
  std::vector<int> field_path{FileDescriptorProto::kMessageTypeFieldNumber, 0,
                              DescriptorProto::kFieldFieldNumber, 0};
  std::vector<const GeneratedCodeInfo::Annotation*> annotations;
  atu::FindAnnotationsOnPath(info, "test.proto", field_path, &annotations);
  EXPECT_TRUE(!annotations.empty());
  for (const auto* annotation : annotations) {
    auto substring = atu::GetAnnotationSubstring(pb_h, *annotation);
    ASSERT_TRUE(substring.has_value());
    if (*substring == "mfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_NONE,
                annotation->semantic());
    } else if (*substring == "clear_mfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_SET,
                annotation->semantic());
    } else if (*substring == "mutable_mfield") {
      EXPECT_EQ(GeneratedCodeInfo_Annotation_Semantic_ALIAS,
                annotation->semantic());
    }
  }
}